

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertUint::test
          (ShaderBitfieldOperationCaseBitfieldInsertUint *this,Data *data)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  GLuint *pGVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  
  iVar4 = this->m_components;
  bVar5 = iVar4 < 1;
  if (0 < iVar4) {
    uVar9 = ~(-1 << ((byte)data->bits & 0x1f));
    if (data->bits == 0x20) {
      uVar9 = 0xffffffff;
    }
    bVar7 = (byte)data->offset;
    uVar10 = ~(uVar9 << (bVar7 & 0x1f));
    if (data->outUvec4[0] ==
        ((data->in2Uvec4[0] & uVar9) << (bVar7 & 0x1f) | data->inUvec4[0] & uVar10)) {
      lVar8 = 1;
      do {
        iVar6 = (int)lVar8;
        if (iVar4 == iVar6) break;
        pGVar1 = data->inUvec4 + lVar8;
        pGVar2 = data->in2Uvec4 + lVar8;
        pGVar3 = data->outUvec4 + lVar8;
        lVar8 = lVar8 + 1;
      } while (*pGVar3 == ((*pGVar2 & uVar9) << (bVar7 & 0x1f) | *pGVar1 & uVar10));
      bVar5 = iVar4 <= iVar6;
    }
  }
  return bVar5;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint mask = (data->bits == 32) ? ~0u : (1 << data->bits) - 1;
			GLuint expected =
				(data->inUvec4[i] & ~(mask << data->offset)) | ((data->in2Uvec4[i] & mask) << data->offset);
			if (data->outUvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}